

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

void __thiscall
Token::Token(Token *this,string *lexeme,TokenType type,unsigned_long line,unsigned_long col)

{
  unsigned_long col_local;
  unsigned_long line_local;
  TokenType type_local;
  string *lexeme_local;
  Token *this_local;
  
  this->type = Unknown;
  std::__cxx11::string::string((string *)&this->lexeme);
  this->line = 0;
  this->col = 0;
  this->type = type;
  std::__cxx11::string::operator=((string *)&this->lexeme,(string *)lexeme);
  this->line = line;
  this->col = col;
  return;
}

Assistant:

Token(std::string lexeme, TokenType type, unsigned long line, unsigned long col) {
        Token::type = type;
        Token::lexeme = lexeme;
        Token::line = line;
        Token::col = col;
    }